

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::RALocalAllocator::onSaveReg
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId)

{
  RAAssignment *this_00;
  uint32_t uVar1;
  Error EVar2;
  
  this_00 = &this->_curAssignment;
  uVar1 = RAAssignment::workToPhysId(this_00,group,workId);
  if (uVar1 != physId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/../core/ralocal_p.h"
               ,0xd7,"_curAssignment.workToPhysId(group, workId) == physId");
  }
  uVar1 = RAAssignment::physToWorkId(this_00,group,physId);
  if (uVar1 == workId) {
    RAAssignment::makeClean(this_00,group,workId,physId);
    EVar2 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                      (this->_pass,(ulong)workId,(ulong)physId);
    return EVar2;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/../core/ralocal_p.h"
             ,0xd8,"_curAssignment.physToWorkId(group, physId) == workId");
}

Assistant:

inline Error onSaveReg(RegGroup group, uint32_t workId, uint32_t physId) noexcept {
    ASMJIT_ASSERT(_curAssignment.workToPhysId(group, workId) == physId);
    ASMJIT_ASSERT(_curAssignment.physToWorkId(group, physId) == workId);

    _curAssignment.makeClean(group, workId, physId);
    return _pass->emitSave(workId, physId);
  }